

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O2

optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> * __thiscall
ear::QuadRegion::handle
          (optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *__return_storage_ptr__,
          QuadRegion *this,Vector3d *position)

{
  double dVar1;
  Scalar SVar2;
  reference_type pdVar3;
  CommaInitializer<Eigen::IndexedView<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_Eigen::internal::SingleRange>_>
  *pCVar4;
  long lVar5;
  long lVar6;
  Matrix3d *pMVar7;
  QuadRegion *pQVar8;
  byte bVar9;
  optional<double> oVar10;
  optional<double> oVar11;
  VectorXd pvs;
  optional<double> y;
  optional<double> x;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_158;
  CommaInitializer<Eigen::IndexedView<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_Eigen::internal::SingleRange>_>
  local_150;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_130;
  double local_110;
  double local_108;
  double local_100;
  Vector3d local_f8;
  Vector3d local_d8;
  undefined1 local_c0 [144];
  
  local_130.m_rhs = (RhsNested)local_130.m_lhs.m_matrix;
  bVar9 = 0;
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0];
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[1];
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[2];
  lVar6 = 9;
  pMVar7 = &this->_polyBasisX;
  pQVar8 = (QuadRegion *)(local_c0 + 0x48);
  for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pQVar8->super_RegionHandler)._vptr_RegionHandler =
         (_func_int **)
         (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[0];
    pMVar7 = (Matrix3d *)
             ((pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
              m_data.array + 1);
    pQVar8 = (QuadRegion *)&(pQVar8->super_RegionHandler)._outputChannels;
  }
  oVar10 = _pan(pQVar8,&local_d8,(Matrix3d *)(local_c0 + 0x48));
  x.super_type.m_storage = oVar10.super_type.m_storage;
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[1];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[2];
  pMVar7 = &this->_polyBasisY;
  pQVar8 = (QuadRegion *)local_c0;
  for (; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pQVar8->super_RegionHandler)._vptr_RegionHandler =
         (_func_int **)
         (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[0];
    pMVar7 = (Matrix3d *)((long)pMVar7 + (ulong)bVar9 * -0x10 + 8);
    pQVar8 = (QuadRegion *)((long)pQVar8 + (ulong)bVar9 * -0x10 + 8);
  }
  x.super_type.m_initialized = oVar10.super_type.m_initialized;
  oVar11 = _pan(pQVar8,&local_f8,(Matrix3d *)local_c0);
  y.super_type.m_initialized = oVar11.super_type.m_initialized;
  y.super_type.m_storage = oVar11.super_type.m_storage;
  if ((oVar10.super_type.m_initialized & y.super_type.m_initialized & 1U) == 0) {
    (__return_storage_ptr__->super_type).m_initialized = false;
  }
  else {
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::Zero();
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&pvs,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
                *)&local_150);
    Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator()
              ((type *)&local_130,(DenseBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&pvs,&this->_order
              );
    pdVar3 = boost::optional<double>::get(&x);
    dVar1 = *pdVar3;
    pdVar3 = boost::optional<double>::get(&y);
    local_158 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
                ((1.0 - *pdVar3) * (1.0 - dVar1));
    Eigen::
    CommaInitializer<Eigen::IndexedView<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_Eigen::internal::SingleRange>_>
    ::CommaInitializer(&local_150,
                       (IndexedView<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_Eigen::internal::SingleRange>
                        *)&local_130,(Scalar *)&local_158);
    pdVar3 = boost::optional<double>::get(&x);
    dVar1 = *pdVar3;
    pdVar3 = boost::optional<double>::get(&y);
    local_100 = dVar1 * (1.0 - *pdVar3);
    pCVar4 = Eigen::
             CommaInitializer<Eigen::IndexedView<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_Eigen::internal::SingleRange>_>
             ::operator_(&local_150,&local_100);
    pdVar3 = boost::optional<double>::get(&x);
    dVar1 = *pdVar3;
    pdVar3 = boost::optional<double>::get(&y);
    local_108 = dVar1 * *pdVar3;
    pCVar4 = Eigen::
             CommaInitializer<Eigen::IndexedView<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_Eigen::internal::SingleRange>_>
             ::operator_(pCVar4,&local_108);
    pdVar3 = boost::optional<double>::get(&x);
    dVar1 = *pdVar3;
    pdVar3 = boost::optional<double>::get(&y);
    local_110 = (1.0 - dVar1) * *pdVar3;
    Eigen::
    CommaInitializer<Eigen::IndexedView<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_Eigen::internal::SingleRange>_>
    ::operator_(pCVar4,&local_110);
    Eigen::
    CommaInitializer<Eigen::IndexedView<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_Eigen::internal::SingleRange>_>
    ::~CommaInitializer(&local_150);
    free(local_130.m_rhs);
    local_158 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&pvs;
    local_130 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>>>::operator*
                          ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>> *)
                           &local_158,
                           (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                           &(this->super_RegionHandler)._positions);
    Eigen::
    Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
    ::Product((Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
               *)&local_150,&local_130,position);
    SVar2 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_150);
    if (0.0 < SVar2) {
      local_150.m_xpr =
           (IndexedView<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_Eigen::internal::SingleRange>
            *)Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                        ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&pvs);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator/=
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&pvs,(Scalar *)&local_150);
      (__return_storage_ptr__->super_type).m_storage.dummy_.aligner_ =
           (type)pvs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      ;
      *(Index *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 8) =
           pvs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      pvs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      pvs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    }
    (__return_storage_ptr__->super_type).m_initialized = 0.0 < SVar2;
    free(pvs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  }
  return __return_storage_ptr__;
}

Assistant:

boost::optional<Eigen::VectorXd> QuadRegion::handle(
      Eigen::Vector3d position) const {
    boost::optional<double> x = _pan(position, _polyBasisX);
    boost::optional<double> y = _pan(position, _polyBasisY);

    if (x == boost::none || y == boost::none) {
      return boost::none;
    }

    Eigen::VectorXd pvs = Eigen::Vector4d::Zero();
    pvs(_order) << (1 - x.get()) * (1 - y.get()), x.get() * (1 - y.get()),
        x.get() * y.get(), (1 - x.get()) * y.get();
    if ((pvs.transpose() * _positions) * position <= 0) {
      return boost::none;
    }
    pvs /= pvs.norm();
    return pvs;
  }